

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O3

void thread_pool::ThreadPool::Task(ThreadPool *thread_pool)

{
  __int_type _Var1;
  _Elt_pointer pfVar2;
  _Manager_type p_Var3;
  type task;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  
  do {
    Semaphore::Wait(&thread_pool->thread_semaphore_);
    if (((thread_pool->terminate_)._M_base._M_i & 1U) != 0) {
      return;
    }
    Semaphore::Wait(&thread_pool->queue_semaphore_);
    pfVar2 = (thread_pool->queue_).c.
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = (_Manager_type)0x0;
    local_40 = pfVar2->_M_invoker;
    p_Var3 = (pfVar2->super__Function_base)._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      local_58._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(pfVar2->super__Function_base)._M_functor;
      local_58._8_8_ = *(undefined8 *)((long)&(pfVar2->super__Function_base)._M_functor + 8);
      (pfVar2->super__Function_base)._M_manager = (_Manager_type)0x0;
      pfVar2->_M_invoker = (_Invoker_type)0x0;
      local_48 = p_Var3;
    }
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&(thread_pool->queue_).c);
    Semaphore::Signal(&thread_pool->queue_semaphore_);
    _Var1 = (thread_pool->terminate_)._M_base._M_i;
    if ((_Var1 & 1U) == 0) {
      if (local_48 == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*local_40)(&local_58);
    }
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  } while ((_Var1 & 1U) == 0);
  return;
}

Assistant:

static void Task(ThreadPool* thread_pool) {
    while (true) {
      thread_pool->thread_semaphore_.Wait();

      if (thread_pool->terminate_) {
        break;
      }

      thread_pool->queue_semaphore_.Wait();
      auto task = std::move(thread_pool->queue_.front());
      thread_pool->queue_.pop();
      thread_pool->queue_semaphore_.Signal();

      if (thread_pool->terminate_) {
        break;
      }

      task();
    }
  }